

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O0

QVariant * __thiscall QMimeDataPrivate::getData(QMimeDataPrivate *this,QString *format)

{
  bool bVar1;
  QMimeDataPrivate *in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QVariant *this_00;
  __normal_iterator<const_QMimeDataStruct_*,_std::vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_>_>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10._M_current = (QMimeDataStruct *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  local_10._M_current = (QMimeDataStruct *)find(in_RSI,(QString *)in_RDI);
  std::vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_>::cend
            ((vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_> *)this_00);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_QMimeDataStruct_*,_std::vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_>_>
                      *)this_00,
                     (__normal_iterator<const_QMimeDataStruct_*,_std::vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_>_>
                      *)in_RDI);
  if (bVar1) {
    ::QVariant::QVariant((QVariant *)0x3e3cf7);
  }
  else {
    __gnu_cxx::
    __normal_iterator<const_QMimeDataStruct_*,_std::vector<QMimeDataStruct,_std::allocator<QMimeDataStruct>_>_>
    ::operator->(&local_10);
    ::QVariant::QVariant(this_00,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QMimeDataPrivate::getData(const QString &format) const
{
    const auto it = find(format);
    if (it == dataList.cend())
        return {};
    else
        return it->data;
}